

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O1

void cf_ctr_init(cf_ctr *ctx,cf_prp *prp,void *prpctx,uint8_t *nonce)

{
  size_t __n;
  
  ctx->nkeymat = 0;
  ctx->counter_offset = 0;
  ctx->keymat[0] = '\0';
  ctx->keymat[1] = '\0';
  ctx->keymat[2] = '\0';
  ctx->keymat[3] = '\0';
  ctx->keymat[4] = '\0';
  ctx->keymat[5] = '\0';
  ctx->keymat[6] = '\0';
  ctx->keymat[7] = '\0';
  ctx->keymat[8] = '\0';
  ctx->keymat[9] = '\0';
  ctx->keymat[10] = '\0';
  ctx->keymat[0xb] = '\0';
  ctx->keymat[0xc] = '\0';
  ctx->keymat[0xd] = '\0';
  ctx->keymat[0xe] = '\0';
  ctx->keymat[0xf] = '\0';
  ctx->nonce[0] = '\0';
  ctx->nonce[1] = '\0';
  ctx->nonce[2] = '\0';
  ctx->nonce[3] = '\0';
  ctx->nonce[4] = '\0';
  ctx->nonce[5] = '\0';
  ctx->nonce[6] = '\0';
  ctx->nonce[7] = '\0';
  ctx->nonce[8] = '\0';
  ctx->nonce[9] = '\0';
  ctx->nonce[10] = '\0';
  ctx->nonce[0xb] = '\0';
  ctx->nonce[0xc] = '\0';
  ctx->nonce[0xd] = '\0';
  ctx->nonce[0xe] = '\0';
  ctx->nonce[0xf] = '\0';
  ctx->prp = (cf_prp *)0x0;
  ctx->prpctx = (void *)0x0;
  ctx->counter_width = 0;
  __n = prp->blocksz;
  ctx->counter_width = __n;
  ctx->prp = prp;
  ctx->prpctx = prpctx;
  ctx->nkeymat = 0;
  memcpy(ctx->nonce,nonce,__n);
  return;
}

Assistant:

void cf_ctr_init(cf_ctr *ctx, const cf_prp *prp, void *prpctx, const uint8_t nonce[CF_MAXBLOCK])
{
  memset(ctx, 0, sizeof *ctx);
  ctx->counter_offset = 0;
  ctx->counter_width = prp->blocksz;
  ctx->prp = prp;
  ctx->prpctx = prpctx;
  ctx->nkeymat = 0;
  memcpy(ctx->nonce, nonce, prp->blocksz);
}